

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O0

int inform_bin_step(double *series,size_t n,double step,int *binned,inform_error *err)

{
  double dVar1;
  double dVar2;
  double local_60;
  size_t i;
  int b;
  double range;
  double max;
  double min;
  inform_error *err_local;
  int *binned_local;
  double step_local;
  size_t n_local;
  double *series_local;
  
  if (series == (double *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local._4_4_ = INFORM_SUCCESS;
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
    series_local._4_4_ = INFORM_SUCCESS;
  }
  else if (2.220446049250313e-15 < step) {
    if (binned == (int *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ETIMESERIES;
      }
      series_local._4_4_ = INFORM_SUCCESS;
    }
    else {
      min = (double)err;
      err_local = binned;
      binned_local = (int *)step;
      step_local = (double)n;
      n_local = (size_t)series;
      dVar1 = inform_range(series,n,&max,&range,err);
      dVar2 = ceil(dVar1 / (double)binned_local);
      i._4_4_ = (inform_error)dVar2;
      dVar1 = fmod(dVar1,(double)binned_local);
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        i._4_4_ = i._4_4_ + INFORM_EFAULT;
      }
      for (local_60 = 0.0; (ulong)local_60 < (ulong)step_local;
          local_60 = (double)((long)local_60 + 1)) {
        dVar1 = floor((*(double *)(n_local + (long)local_60 * 8) - max) / (double)binned_local);
        err_local[(long)local_60] = (int)dVar1;
        if ((err_local[(long)local_60] < INFORM_SUCCESS) || (i._4_4_ <= err_local[(long)local_60]))
        {
          __assert_fail("0 <= binned[i] && binned[i] < b",
                        "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                        ,0x51,
                        "int inform_bin_step(const double *, size_t, double, int *, inform_error *)"
                       );
        }
      }
      series_local._4_4_ = i._4_4_;
    }
  }
  else {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBIN;
    }
    series_local._4_4_ = INFORM_SUCCESS;
  }
  return series_local._4_4_;
}

Assistant:

int inform_bin_step(double const *series, size_t n, double step, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (step <= 10.*DBL_EPSILON)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    int b = (int) ceil(range / step);

    if (fmod(range,step) == 0.0) ++b;

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return b;
}